

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O2

array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
* detail::operator|(array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
                    *__return_storage_ptr__,b_str<wchar_t> *str,
                   split_helper_subroutine<detail::split_at_first,_wchar_t,_wchar_t> *info)

{
  ulong uVar1;
  wstring local_40 [32];
  
  uVar1 = std::__cxx11::wstring::find((wchar_t)str,(ulong)(uint)info->delim);
  if (uVar1 == 0xffffffffffffffff) {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)str);
    __return_storage_ptr__->_M_elems[1]._M_dataplus._M_p =
         (pointer)&__return_storage_ptr__->_M_elems[1].field_2;
    __return_storage_ptr__->_M_elems[1]._M_string_length = 0;
    __return_storage_ptr__->_M_elems[1].field_2._M_local_buf[0] = L'\0';
  }
  else {
    std::
    array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
    ::array(__return_storage_ptr__);
    std::__cxx11::wstring::find_first_not_of((wchar_t)str,(ulong)(uint)info->delim);
    std::__cxx11::wstring::substr((ulong)local_40,(ulong)str);
    std::__cxx11::wstring::operator=((wstring *)(__return_storage_ptr__->_M_elems + 1),local_40);
    std::__cxx11::wstring::~wstring(local_40);
    std::__cxx11::wstring::erase((ulong)str,uVar1);
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { std::move(str),{} } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(str.find_first_not_of(info.delim, pos));
		str.erase(pos);
		re[0] = std::move(str);
		return re;
	}